

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O2

EGLContext
eglu::createGLContext
          (Library *egl,EGLDisplay display,EGLContext eglConfig,ContextType *contextType,
          ResetNotificationStrategy resetNotificationStrategy)

{
  EGLint EVar1;
  EGLint EVar2;
  bool bVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  NotSupportedError *this;
  InternalError *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  undefined8 uVar8;
  EGLint flags;
  vector<int,_std::allocator<int>_> attribList;
  allocator<char> local_69;
  string local_68;
  ResetNotificationStrategy local_44;
  Version local_40;
  Version local_38;
  
  local_44 = resetNotificationStrategy;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EGL_KHR_create_context",(allocator<char> *)&attribList);
  bVar3 = hasExtension(egl,display,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uVar4 = (contextType->super_ApiType).m_bits;
  if ((uVar4 & 0x300) == 0) {
    if ((uVar4 & 0xf) < 3) {
      local_68._M_dataplus._M_p._0_4_ = 0x3098;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
      local_68._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits & 0xf;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    }
    else {
      if (!bVar3) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this,"EGL_KHR_create_context is required for OpenGL ES 3.0 and newer",(char *)0x0
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0x66);
        goto LAB_00265f5b;
      }
      local_68._M_dataplus._M_p._0_4_ = 0x3098;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
      local_68._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits & 0xf;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
      local_68._M_dataplus._M_p._0_4_ = 0x30fb;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
      local_68._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits >> 4 & 0xf;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    }
    uVar8 = 0x30a0;
  }
  else {
    if (!bVar3) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"EGL_KHR_create_context is required for OpenGL context creation",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x73);
LAB_00265f5b:
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_68._M_dataplus._M_p._0_4_ = 0x3098;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits & 0xf;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = 0x30fb;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits >> 4 & 0xf;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = 0x30fd;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = (((contextType->super_ApiType).m_bits & 0x300) != 0x100) + 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    uVar8 = 0x30a2;
  }
  uVar4 = (contextType->super_ApiType).m_bits;
  if ((uVar4 & 0x1c00) == 0) goto LAB_00265d9d;
  flags = 0;
  if (!bVar3) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,
               "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0x85);
LAB_00265e93:
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
    goto LAB_00265f25;
  }
  bVar3 = (uVar4 >> 0xb & 1) != 0;
  if (bVar3) {
    EVar1 = 5;
  }
  else {
    EVar1 = 4;
  }
  flags = (EGLint)bVar3;
  EVar2 = flags;
  if (((uVar4 >> 10 & 1) != 0) && (EVar2 = EVar1, (uVar4 & 0x300) == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"EGL_EXT_create_context_robustness",&local_69);
    bVar3 = hasExtension(egl,display,&local_68);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      local_40 = getVersion(egl,display);
      local_38.m_major = 1;
      local_38.m_minor = 5;
      bVar3 = Version::operator<(&local_40,&local_38);
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar3) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  ((NotSupportedError *)this_00,
                   "EGL_EXT_create_context_robustness is required for creating robust context",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0x8f);
        goto LAB_00265e93;
      }
    }
    local_68._M_dataplus._M_p._0_4_ = 0x30bf;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    local_68._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    uVar4 = (contextType->super_ApiType).m_bits;
    EVar2 = flags;
  }
  flags = EVar2;
  if ((uVar4 >> 0xc & 1) == 0) {
LAB_00265d13:
    local_68._M_dataplus._M_p._0_4_ = 0x30fc;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
    std::vector<int,_std::allocator<int>_>::push_back(&attribList,&flags);
    if (local_44 == RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED) goto LAB_00265d9d;
    if (((contextType->super_ApiType).m_bits & 0x300) == 0) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,
                 "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xa6);
    }
    else {
      local_68._M_dataplus._M_p._0_4_ = 0x31bd;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
      if (local_44 == RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET) {
        local_68._M_dataplus._M_p._0_4_ = 0x31bf;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
LAB_00265d9d:
        local_68._M_dataplus._M_p._0_4_ = 0x3038;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
        (**egl->_vptr_Library)(egl,uVar8);
        dVar5 = (*egl->_vptr_Library[0x1f])(egl);
        checkError(dVar5,"bindAPI(api)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xb5);
        iVar6 = (*egl->_vptr_Library[6])
                          (egl,display,eglConfig,0,
                           attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
        dVar5 = (*egl->_vptr_Library[0x1f])(egl);
        checkError(dVar5,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xb7);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&attribList.super__Vector_base<int,_std::allocator<int>_>);
        return (EGLContext)CONCAT44(extraout_var,iVar6);
      }
      if (local_44 == RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION) {
        local_68._M_dataplus._M_p._0_4_ = 0x31be;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,(int *)&local_68);
        goto LAB_00265d9d;
      }
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Unknown reset notification strategy",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xaf);
    }
  }
  else {
    if ((uVar4 & 0x300) == 0x100) {
      flags = flags | 2;
      goto LAB_00265d13;
    }
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Only OpenGL core contexts can be forward-compatible",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0x9b);
  }
  ppuVar7 = &tcu::InternalError::typeinfo;
LAB_00265f25:
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

EGLContext createGLContext (const Library&					egl,
							EGLDisplay						display,
							EGLContext						eglConfig,
							const glu::ContextType&			contextType,
							glu::ResetNotificationStrategy	resetNotificationStrategy)
{
	const bool			khrCreateContextSupported	= hasExtension(egl, display, "EGL_KHR_create_context");
	EGLContext			context						= EGL_NO_CONTEXT;
	EGLenum				api							= EGL_NONE;
	vector<EGLint>		attribList;

	if (glu::isContextTypeES(contextType))
	{
		api = EGL_OPENGL_ES_API;

		if (contextType.getMajorVersion() <= 2)
		{
			attribList.push_back(EGL_CONTEXT_CLIENT_VERSION);
			attribList.push_back(contextType.getMajorVersion());
		}
		else
		{
			if (!khrCreateContextSupported)
				TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL ES 3.0 and newer");

			attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
			attribList.push_back(contextType.getMajorVersion());
			attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
			attribList.push_back(contextType.getMinorVersion());
		}
	}
	else
	{
		DE_ASSERT(glu::isContextTypeGLCore(contextType) || glu::isContextTypeGLCompatibility(contextType));

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL context creation");

		api = EGL_OPENGL_API;

		attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
		attribList.push_back(contextType.getMajorVersion());
		attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
		attribList.push_back(contextType.getMinorVersion());
		attribList.push_back(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
		attribList.push_back(glu::isContextTypeGLCore(contextType) ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
																   : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
	}

	if (contextType.getFlags() != glu::ContextFlags(0))
	{
		EGLint flags = 0;

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts");

		if ((contextType.getFlags() & glu::CONTEXT_DEBUG) != 0)
			flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;

		if ((contextType.getFlags() & glu::CONTEXT_ROBUST) != 0)
		{
			if (glu::isContextTypeES(contextType))
			{
				if (!hasExtension(egl, display, "EGL_EXT_create_context_robustness") && (getVersion(egl, display) < Version(1, 5)))
					TCU_THROW(NotSupportedError, "EGL_EXT_create_context_robustness is required for creating robust context");

				attribList.push_back(EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT);
				attribList.push_back(EGL_TRUE);
			}
			else
				flags |= EGL_CONTEXT_OPENGL_ROBUST_ACCESS_BIT_KHR;
		}

		if ((contextType.getFlags() & glu::CONTEXT_FORWARD_COMPATIBLE) != 0)
		{
			if (!glu::isContextTypeGLCore(contextType))
				TCU_THROW(InternalError, "Only OpenGL core contexts can be forward-compatible");

			flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
		}

		attribList.push_back(EGL_CONTEXT_FLAGS_KHR);
		attribList.push_back(flags);

		if (resetNotificationStrategy != glu::RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
		{
			if (glu::isContextTypeES(contextType))
				TCU_THROW(InternalError, "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts");

			attribList.push_back(EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR);

			if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION)
				attribList.push_back(EGL_NO_RESET_NOTIFICATION_KHR);
			else if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET)
				attribList.push_back(EGL_LOSE_CONTEXT_ON_RESET_KHR);
			else
				TCU_THROW(InternalError, "Unknown reset notification strategy");
		}
	}

	attribList.push_back(EGL_NONE);

	EGLU_CHECK_CALL(egl, bindAPI(api));
	context = egl.createContext(display, eglConfig, EGL_NO_CONTEXT, &(attribList[0]));
	EGLU_CHECK_MSG(egl, "eglCreateContext()");

	return context;
}